

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

ram_addr_t qemu_ram_addr_from_host_riscv64(uc_struct_conflict13 *uc,void *ptr)

{
  RAMBlock *pRVar1;
  ram_addr_t local_30;
  ram_addr_t offset;
  RAMBlock *block;
  void *ptr_local;
  uc_struct_conflict13 *uc_local;
  
  block = (RAMBlock *)ptr;
  ptr_local = uc;
  pRVar1 = qemu_ram_block_from_host_riscv64(uc,ptr,false,&local_30);
  if (pRVar1 == (RAMBlock *)0x0) {
    uc_local = (uc_struct_conflict13 *)0xffffffffffffffff;
  }
  else {
    uc_local = (uc_struct_conflict13 *)(pRVar1->offset + local_30);
  }
  return (ram_addr_t)uc_local;
}

Assistant:

ram_addr_t qemu_ram_addr_from_host(struct uc_struct *uc, void *ptr)
{
    RAMBlock *block;
    ram_addr_t offset;

    block = qemu_ram_block_from_host(uc, ptr, false, &offset);
    if (!block) {
        return RAM_ADDR_INVALID;
    }

    return block->offset + offset;
}